

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegdec.c
# Opt level: O2

void ContextSkip(j_decompress_ptr cinfo,long jump_size)

{
  jpeg_source_mgr *pjVar1;
  ulong uVar2;
  
  pjVar1 = cinfo->src;
  uVar2 = pjVar1->bytes_in_buffer;
  if (uVar2 < (ulong)jump_size) {
    jump_size = uVar2;
  }
  pjVar1->bytes_in_buffer = uVar2 - jump_size;
  pjVar1->next_input_byte = pjVar1->next_input_byte + jump_size;
  return;
}

Assistant:

static void ContextSkip(j_decompress_ptr cinfo, long jump_size) {
  JPEGReadContext* const ctx = (JPEGReadContext*)cinfo->src;
  size_t jump = (size_t)jump_size;
  if (jump > ctx->pub.bytes_in_buffer) {  // Don't overflow the buffer.
    jump = ctx->pub.bytes_in_buffer;
  }
  ctx->pub.bytes_in_buffer -= jump;
  ctx->pub.next_input_byte += jump;
}